

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O1

void __thiscall glcts::StringStream::reset(StringStream *this)

{
  long *local_38 [2];
  long local_28 [2];
  
  std::ios::clear((int)(this->super_ostringstream).
                       super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3] +
                  (int)this);
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,0x1b32ab9);
  std::__cxx11::stringbuf::str
            ((string *)
             &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
              field_0x8);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

void reset()
	{
		clear();
		str("");
	}